

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Cnf_AddCardinConstrGeneral(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int Lit;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  sat_solver *local_b8;
  Vec_Int_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  ulong local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  int local_68;
  int local_64;
  ulong local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = fStrict;
  local_64 = K;
  iVar2 = sat_solver_nvars(p);
  local_60 = CONCAT44(extraout_var,iVar2);
  iVar3 = vVars->nSize;
  uVar7 = (ulong)iVar3;
  if (0 < (long)uVar7) {
    uVar5 = 0;
    do {
      if ((vVars->pArray[uVar5] < 0) || (iVar2 <= vVars->pArray[uVar5])) {
        __assert_fail("iVar >= 0 && iVar < nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0xad,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  local_b8 = p;
  sat_solver_setnvars(p,iVar3 * iVar3 + iVar2);
  if (0 < iVar3) {
    uVar5 = (ulong)(iVar3 - 1);
    local_48 = local_60 & 0xffffffff;
    local_50 = (long)(int)local_60;
    uVar8 = (ulong)(uint)((int)local_60 - iVar3);
    uVar6 = 0;
    local_78 = local_60 & 0xffffffff;
    local_94 = 0;
    local_b0 = vVars;
    local_88 = uVar5;
    local_40 = uVar7;
    do {
      psVar1 = local_b8;
      local_58 = (uVar6 - 1) * uVar7 + local_48;
      local_80 = uVar6 * uVar7 + local_50;
      uVar9 = (ulong)((uint)uVar6 & 1);
      local_a8 = uVar8;
      local_90 = uVar6;
      if ((uVar6 & 1) != 0) {
        uVar11 = (uint)local_58;
        if (uVar6 == 0) {
          if (local_b0->nSize < 1) goto LAB_00531249;
          uVar11 = *local_b0->pArray;
        }
        local_a0 = uVar9;
        if ((int)((uint)local_80 | uVar11) < 0) goto LAB_00531287;
        uVar10 = (uint)local_80 * 2;
        local_c0 = uVar11 * 2 + 1;
        local_c4 = uVar10;
        iVar3 = sat_solver_addclause(local_b8,(lit *)&local_c4,(lit *)&local_bc);
        uVar5 = local_88;
        uVar9 = local_a0;
        vVars = local_b0;
        if (iVar3 != 0) {
          local_c0 = uVar11 * 2;
          local_c4 = uVar10 | 1;
          sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_bc);
          uVar5 = local_88;
          uVar9 = local_a0;
          vVars = local_b0;
        }
      }
      if ((int)uVar9 + 1 < (int)uVar7) {
        uVar9 = (ulong)(local_94 & 1);
        uVar11 = ((int)local_78 + (local_94 & 1)) * 2;
        do {
          psVar1 = local_b8;
          if (local_90 == 0) {
            if ((long)vVars->nSize <= (long)uVar9) goto LAB_00531249;
            iVar3 = vVars->pArray[uVar9];
          }
          else {
            iVar3 = (int)local_a8 + (int)uVar9;
          }
          local_38 = uVar9 + 1;
          local_a0 = uVar9;
          if (local_90 == 0) {
            if (vVars->nSize <= (int)local_38) goto LAB_00531249;
            iVar2 = vVars->pArray[local_38 & 0xffffffff];
          }
          else {
            iVar2 = (int)local_a8 + (int)uVar9 + 1;
          }
          local_c0 = iVar3 * 2 + 1;
          local_c4 = uVar11;
          iVar4 = sat_solver_addclause(local_b8,(lit *)&local_c4,(lit *)&local_bc);
          if (iVar4 == 0) {
LAB_0053120b:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x16b,
                          "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
          }
          local_c0 = iVar2 * 2 + 1;
          local_c4 = uVar11;
          iVar4 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_bc);
          if (iVar4 == 0) {
LAB_0053122a:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x170,
                          "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
          }
          local_c0 = iVar3 * 2;
          local_bc = iVar2 * 2;
          local_c4 = uVar11 + 1;
          local_70 = (ulong)uVar11;
          iVar3 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_b8);
          if (iVar3 == 0) {
LAB_005311ec:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x176,
                          "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
          }
          if (local_90 == 0) {
            if ((long)local_b0->nSize <= (long)local_a0) goto LAB_00531249;
            iVar3 = local_b0->pArray[local_a0];
          }
          else {
            iVar3 = (int)local_a8 + (int)local_a0;
          }
          if (local_90 == 0) {
            if (local_b0->nSize <= (int)local_38) goto LAB_00531249;
            iVar2 = local_b0->pArray[local_38 & 0xffffffff];
          }
          else {
            iVar2 = (int)local_a8 + (int)local_a0 + 1;
          }
          uVar11 = (int)local_70 + 3;
          local_c4 = uVar11;
          local_c0 = iVar3 * 2;
          iVar4 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_bc);
          if (iVar4 == 0) goto LAB_0053120b;
          local_c4 = uVar11;
          local_c0 = iVar2 * 2;
          iVar4 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_bc);
          if (iVar4 == 0) goto LAB_0053122a;
          iVar4 = (int)local_70;
          local_c4 = iVar4 + 2;
          local_c0 = iVar3 * 2 | 1;
          local_bc = iVar2 * 2 | 1;
          iVar3 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_b8);
          if (iVar3 == 0) goto LAB_005311ec;
          uVar9 = local_a0 + 2;
          uVar11 = iVar4 + 4;
          uVar7 = local_40;
          uVar5 = local_88;
          vVars = local_b0;
        } while ((int)local_a0 + 3 < (int)local_40);
      }
      psVar1 = local_b8;
      iVar3 = (int)uVar5;
      if ((int)uVar9 == iVar3) {
        if (local_90 == 0) {
          if (vVars->nSize < (int)uVar7) {
LAB_00531249:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar11 = vVars->pArray[uVar5];
        }
        else {
          uVar11 = (int)local_58 + iVar3;
        }
        uVar10 = (int)local_80 + iVar3;
        if ((int)(uVar11 | uVar10) < 0) {
LAB_00531287:
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x13f,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
        }
        uVar10 = uVar10 * 2;
        local_c0 = uVar11 * 2 + 1;
        local_c4 = uVar10;
        iVar3 = sat_solver_addclause(local_b8,(lit *)&local_c4,(lit *)&local_bc);
        uVar5 = local_88;
        if (iVar3 != 0) {
          local_c0 = uVar11 * 2;
          local_c4 = uVar10 | 1;
          sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_bc);
          uVar5 = local_88;
        }
      }
      uVar6 = local_90 + 1;
      local_94 = local_94 + 1;
      uVar8 = local_a8 + uVar7;
      local_78 = (ulong)(uint)((int)local_78 + (int)uVar7);
    } while (uVar6 != uVar7);
  }
  psVar1 = local_b8;
  if ((local_64 < 1) || (iVar3 = (int)uVar7, iVar3 <= local_64)) {
    __assert_fail("K > 0 && K < nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0xbe,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
  }
  iVar3 = (int)local_60 + local_64 + (iVar3 + -1) * iVar3;
  if (iVar3 < 0) {
LAB_005312a6:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  local_c4 = iVar3 * 2 + 1;
  iVar2 = sat_solver_addclause(local_b8,(lit *)&local_c4,(lit *)&local_c0);
  if (iVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0xc1,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (local_68 != 0) {
    if (iVar3 == 0) goto LAB_005312a6;
    local_c4 = iVar3 * 2 - 2;
    iVar3 = sat_solver_addclause(psVar1,(lit *)&local_c4,(lit *)&local_c0);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xc6,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Cnf_AddCardinConstrGeneral( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int i, k, iCur, iNext, iVar, Lit;
    int nVars = sat_solver_nvars(p);
    int nBits = Vec_IntSize(vVars);
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    sat_solver_setnvars( p, nVars + nBits * nBits );
    for ( i = 0; i < nBits; i++ )
    {
        iCur = nVars + nBits * (i-1);
        iNext = nVars + nBits * i;
        if ( i & 1 )
            sat_solver_add_buffer( p, iNext, Cnf_AddCardinVar(i, iCur, vVars, 0), 0 );
        for ( k = i & 1; k + 1 < nBits; k += 2 )
        {
            sat_solver_add_and( p, iNext+k  , Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 1, 1, 1 );
            sat_solver_add_and( p, iNext+k+1, Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 0, 0, 0 );
        }
        if ( k == nBits - 1 )
            sat_solver_add_buffer( p, iNext + nBits-1, Cnf_AddCardinVar(i, iCur, vVars, nBits-1), 0 );
    }
    // add final constraint
    assert( K > 0 && K < nBits );
    Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K, 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K - 1, 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
}